

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::SetLogDestination(LogSeverity severity,char *base_filename)

{
  LogDestination *this;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> l;
  char *base_filename_local;
  LogSeverity severity_local;
  
  l._M_device = (mutex_type *)base_filename;
  std::lock_guard<std::mutex>::lock_guard(&local_20,(mutex_type *)log_mutex);
  this = log_destination(severity);
  anon_unknown_8::LogFileObject::SetBasename(&this->fileobject_,(char *)l._M_device);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

inline void LogDestination::SetLogDestination(LogSeverity severity,
                                              const char* base_filename) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  std::lock_guard<std::mutex> l{log_mutex};
  log_destination(severity)->fileobject_.SetBasename(base_filename);
}